

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

BZFILE * BZ2_bzReadOpen(int *bzerror,FILE *f,int verbosity,int small,void *unused,int nUnused)

{
  int iVar1;
  int ret;
  bzFile *bzf;
  undefined1 *puStack_30;
  int nUnused_local;
  void *unused_local;
  int small_local;
  int verbosity_local;
  FILE *f_local;
  int *bzerror_local;
  
  if (bzerror != (int *)0x0) {
    *bzerror = 0;
  }
  if ((((f == (FILE *)0x0) ||
       ((((small != 0 && (small != 1)) || (verbosity < 0)) || (4 < verbosity)))) ||
      ((unused == (void *)0x0 && (nUnused != 0)))) ||
     ((unused != (void *)0x0 && ((nUnused < 0 || (5000 < nUnused)))))) {
    if (bzerror != (int *)0x0) {
      *bzerror = -2;
    }
    bzerror_local = (int *)0x0;
  }
  else {
    iVar1 = ferror((FILE *)f);
    if (iVar1 == 0) {
      bzerror_local = (int *)malloc(0x13f0);
      if (bzerror_local == (int *)0x0) {
        if (bzerror != (int *)0x0) {
          *bzerror = -3;
        }
        bzerror_local = (int *)0x0;
      }
      else {
        if (bzerror != (int *)0x0) {
          *bzerror = 0;
        }
        if (bzerror_local != (int *)0x0) {
          bzerror_local[0x4fa] = 0;
        }
        *(undefined1 *)(bzerror_local + 0x4fb) = 0;
        *(FILE **)bzerror_local = f;
        bzerror_local[0x4e4] = 0;
        *(undefined1 *)(bzerror_local + 0x4e5) = 0;
        bzerror_local[0x4f4] = 0;
        bzerror_local[0x4f5] = 0;
        bzerror_local[0x4f6] = 0;
        bzerror_local[0x4f7] = 0;
        bzerror_local[0x4f8] = 0;
        bzerror_local[0x4f9] = 0;
        puStack_30 = (undefined1 *)unused;
        for (bzf._4_4_ = nUnused; 0 < bzf._4_4_; bzf._4_4_ = bzf._4_4_ + -1) {
          *(undefined1 *)((long)bzerror_local + (long)bzerror_local[0x4e4] + 8) = *puStack_30;
          bzerror_local[0x4e4] = bzerror_local[0x4e4] + 1;
          puStack_30 = puStack_30 + 1;
        }
        iVar1 = BZ2_bzDecompressInit((bz_stream *)(bzerror_local + 0x4e6),verbosity,small);
        if (iVar1 == 0) {
          bzerror_local[0x4e8] = bzerror_local[0x4e4];
          *(int **)(bzerror_local + 0x4e6) = bzerror_local + 2;
          *(undefined1 *)(bzerror_local + 0x4fb) = 1;
        }
        else {
          if (bzerror != (int *)0x0) {
            *bzerror = iVar1;
          }
          if (bzerror_local != (int *)0x0) {
            bzerror_local[0x4fa] = iVar1;
          }
          free(bzerror_local);
          bzerror_local = (int *)0x0;
        }
      }
    }
    else {
      if (bzerror != (int *)0x0) {
        *bzerror = -6;
      }
      bzerror_local = (int *)0x0;
    }
  }
  return bzerror_local;
}

Assistant:

BZFILE* BZ_API(BZ2_bzReadOpen) 
                   ( int*  bzerror, 
                     FILE* f, 
                     int   verbosity,
                     int   small,
                     void* unused,
                     int   nUnused )
{
   bzFile* bzf = NULL;
   int     ret;

   BZ_SETERR(BZ_OK);

   if (f == NULL || 
       (small != 0 && small != 1) ||
       (verbosity < 0 || verbosity > 4) ||
       (unused == NULL && nUnused != 0) ||
       (unused != NULL && (nUnused < 0 || nUnused > BZ_MAX_UNUSED)))
      { BZ_SETERR(BZ_PARAM_ERROR); return NULL; };

   if (ferror(f))
      { BZ_SETERR(BZ_IO_ERROR); return NULL; };

   bzf = malloc ( sizeof(bzFile) );
   if (bzf == NULL) 
      { BZ_SETERR(BZ_MEM_ERROR); return NULL; };

   BZ_SETERR(BZ_OK);

   bzf->initialisedOk = False;
   bzf->handle        = f;
   bzf->bufN          = 0;
   bzf->writing       = False;
   bzf->strm.bzalloc  = NULL;
   bzf->strm.bzfree   = NULL;
   bzf->strm.opaque   = NULL;
   
   while (nUnused > 0) {
      bzf->buf[bzf->bufN] = *((UChar*)(unused)); bzf->bufN++;
      unused = ((void*)( 1 + ((UChar*)(unused))  ));
      nUnused--;
   }

   ret = BZ2_bzDecompressInit ( &(bzf->strm), verbosity, small );
   if (ret != BZ_OK)
      { BZ_SETERR(ret); free(bzf); return NULL; };

   bzf->strm.avail_in = bzf->bufN;
   bzf->strm.next_in  = bzf->buf;

   bzf->initialisedOk = True;
   return bzf;   
}